

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4s.c
# Opt level: O3

int roslz4_compress(roslz4_stream *str,int action)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = -4;
  if ((uint)action < 2) {
    pvVar1 = str->state;
    iVar2 = -1;
    if (*(int *)((long)pvVar1 + 0x20) == 0) {
      if (*(int *)((long)pvVar1 + 0x30) == 0) {
        iVar2 = writeHeader(str);
        if (iVar2 < 0) {
          return iVar2;
        }
        *(undefined4 *)((long)pvVar1 + 0x30) = 1;
      }
      do {
        while( true ) {
          iVar2 = inputToBuffer(str);
          if (iVar2 < 0) {
            return iVar2;
          }
          if ((action != 1) && (*(int *)((long)pvVar1 + 0x1c) != *(int *)((long)pvVar1 + 0x18)))
          break;
          iVar3 = bufferToOutput(str);
          if (iVar3 < 0) {
            return iVar3;
          }
          if (iVar3 == 0 && iVar2 == 0) {
            if (action == 1) {
              iVar2 = writeEOS(str);
              return iVar2;
            }
            goto LAB_001337b4;
          }
        }
      } while (iVar2 != 0);
LAB_001337b4:
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int roslz4_compress(roslz4_stream *str, int action) {
  int ret;
  stream_state *state = str->state;
  if (action != ROSLZ4_RUN && action != ROSLZ4_FINISH) {
    return ROSLZ4_PARAM_ERROR; // Unrecognized compression action
  } else if (state->finished) {
    return ROSLZ4_ERROR; // Cannot call action on finished stream
  }

  if (!state->wrote_header) {
    ret = writeHeader(str);
    if (ret < 0) { return ret; }
    state->wrote_header = 1;
  }

  // Copy input to internal buffer, compressing when full or finishing stream
  int read = 0, wrote = 0;
  do {
    read = inputToBuffer(str);
    if (read < 0) { return read; }

    wrote = 0;
    if (action == ROSLZ4_FINISH || state->buffer_offset == state->buffer_size) {
      wrote = bufferToOutput(str);
      if (wrote < 0) { return wrote; }
    }
  } while (read > 0 || wrote > 0);

  // Signal end of stream if finishing up, otherwise done
  if (action == ROSLZ4_FINISH) {
    return writeEOS(str);
  } else {
    return ROSLZ4_OK;
  }
}